

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fhandle.h
# Opt level: O0

int __thiscall filehandle::ptr::close(ptr *this,int __fd)

{
  int iVar1;
  system_error *this_00;
  int *piVar2;
  error_category *__ecat;
  ptr *this_local;
  
  if (this->fh != -1) {
    iVar1 = ::close(this->fh);
    if (iVar1 == -1) {
      this->fh = -1;
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      __ecat = (error_category *)std::_V2::generic_category();
      std::system_error::system_error(this_00,iVar1,__ecat,"close");
      __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    this->fh = -1;
  }
  return (int)this;
}

Assistant:

void close()
        {
            if (fh==-1)
                return;
            if (-1 == ::close(fh)) {
                fh = -1;
                throw std::system_error(errno, std::generic_category(), "close");
            }
            fh = -1;
        }